

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promise.h
# Opt level: O3

void __thiscall Promise::Tick(Promise *this)

{
  void *pvVar1;
  pointer psVar2;
  undefined8 uVar3;
  shared_ptr<Promise> *child;
  pointer psVar4;
  __shared_ptr<Promise,(__gnu_cxx::_Lock_policy)2> a_Stack_18 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  if (this->handler_ran == false) {
    this->handler_ran = true;
    if ((this->manually_resolved_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
      if ((this->auto_resolved_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
        this->state = Resolved;
        pvVar1 = this->data;
        if (pvVar1 != (void *)0x0) {
          psVar2 = (this->children).
                   super__Vector_base<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (psVar4 = (this->children).
                        super__Vector_base<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar2;
              psVar4 = psVar4 + 1) {
            ((psVar4->super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->passed_value
                 = pvVar1;
          }
        }
      }
      else {
        (*(this->auto_resolved_handler)._M_invoker)((_Any_data *)&this->auto_resolved_handler);
        this->state = Resolved;
        pvVar1 = this->data;
        if (pvVar1 != (void *)0x0) {
          psVar2 = (this->children).
                   super__Vector_base<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (psVar4 = (this->children).
                        super__Vector_base<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar2;
              psVar4 = psVar4 + 1) {
            ((psVar4->super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->passed_value
                 = pvVar1;
          }
        }
      }
    }
    else {
      std::__shared_ptr<Promise,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Promise,void>
                (a_Stack_18,
                 (__weak_ptr<Promise,_(__gnu_cxx::_Lock_policy)2> *)
                 &this->super_enable_shared_from_this<Promise>);
      if ((this->manually_resolved_handler).super__Function_base._M_manager == (_Manager_type)0x0) {
        uVar3 = std::__throw_bad_function_call();
        if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
        }
        _Unwind_Resume(uVar3);
      }
      (*(this->manually_resolved_handler)._M_invoker)
                ((_Any_data *)&this->manually_resolved_handler,(shared_ptr<Promise> *)a_Stack_18);
      if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
      }
    }
  }
  return;
}

Assistant:

virtual void Tick() {
    if (!handler_ran) {
      // Setting it before call to have ability to override it in handler
      handler_ran = true;

      if (manually_resolved_handler) {
        manually_resolved_handler(shared_from_this());
      } else if (auto_resolved_handler) {
        auto_resolved_handler();
        Resolve();
      } else {
        Resolve();
      }
    }
  }